

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O0

int __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::RandomHeight
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this)

{
  uint32_t uVar1;
  bool bVar2;
  int local_14;
  int height;
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this_local;
  
  local_14 = 1;
  while( true ) {
    bVar2 = false;
    if (local_14 < 0xc) {
      uVar1 = Random::Next(&this->rnd_);
      bVar2 = (uVar1 & 3) == 0;
    }
    if (!bVar2) break;
    local_14 = local_14 + 1;
  }
  if (0 < local_14) {
    if (local_14 < 0xd) {
      return local_14;
    }
    __assert_fail("height <= kMaxHeight",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/skiplist.h"
                  ,0xfa,
                  "int leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::RandomHeight() [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
                 );
  }
  __assert_fail("height > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/skiplist.h"
                ,0xf9,
                "int leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::RandomHeight() [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
               );
}

Assistant:

int SkipList<Key, Comparator>::RandomHeight() {
  // Increase height with probability 1 in kBranching
  static const unsigned int kBranching = 4;
  int height = 1;
  while (height < kMaxHeight && ((rnd_.Next() % kBranching) == 0)) {
    height++;
  }
  assert(height > 0);
  assert(height <= kMaxHeight);
  return height;
}